

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.hpp
# Opt level: O0

void viennamath::inplace_simplify<viennamath::rt_expression_interface<double>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  uint uVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  while( true ) {
    prVar3 = rt_expr<viennamath::rt_expression_interface<double>_>::get(e);
    uVar1 = (*prVar3->_vptr_rt_expression_interface[0x11])();
    if ((uVar1 & 1) == 0) break;
    prVar3 = rt_expr<viennamath::rt_expression_interface<double>_>::get(e);
    iVar2 = (*prVar3->_vptr_rt_expression_interface[0x10])();
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=
              (e,(rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

void inplace_simplify(rt_expr<InterfaceType> & e)
  {
    while (e.get()->can_simplify())
      e = e.get()->simplify();
  }